

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O3

int ewt(N_Vector y,N_Vector w,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double local_18 [3];
  
  local_18[0] = 1e-08;
  local_18[1] = 1e-14;
  local_18[2] = 1e-06;
  lVar1 = *(long *)((long)y->content + 0x10);
  lVar2 = 0;
  do {
    dVar3 = ABS(*(double *)(lVar1 + lVar2 * 8)) * 0.0001 + local_18[lVar2];
    if (dVar3 <= 0.0) {
      return -1;
    }
    *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8) = 1.0 / dVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return 0;
}

Assistant:

static int ewt(N_Vector y, N_Vector w, void* user_data)
{
  int i;
  sunrealtype yy, ww, rtol, atol[3];

  rtol    = RTOL;
  atol[0] = ATOL1;
  atol[1] = ATOL2;
  atol[2] = ATOL3;

  for (i = 1; i <= 3; i++)
  {
    yy = Ith(y, i);
    ww = rtol * ABS(yy) + atol[i - 1];
    if (ww <= 0.0) { return (-1); }
    Ith(w, i) = 1.0 / ww;
  }

  return (0);
}